

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerPrologEpilog(Lowerer *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EntryInstr *entryInstr;
  JITTimeFunctionBody *this_00;
  LabelInstr *epilogueLabel;
  ExitInstr *exitInstr;
  Func *this_01;
  
  pIVar1 = this->m_func->m_headInstr;
  if (pIVar1->m_kind != InstrKindEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1557,"(instr->IsEntryInstr())","First instr isn\'t an EntryInstr...");
    if (!bVar3) goto LAB_005668e1;
    *puVar4 = 0;
  }
  entryInstr = IR::Instr::AsEntryInstr(pIVar1);
  LowererMD::LowerEntryInstr(&this->m_lowererMD,entryInstr);
  this_01 = this->m_func;
  pIVar1 = this_01->m_exitInstr;
  if (pIVar1->m_kind != InstrKindExit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x155c,"(instr->IsExitInstr())","Last instr isn\'t an ExitInstr...");
    if (!bVar3) {
LAB_005668e1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this_01 = this->m_func;
  }
  this_00 = Func::GetJITFunctionBody(this_01);
  bVar3 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar3) {
    bVar3 = Func::IsLoopBody(this->m_func);
    if (!bVar3) {
      epilogueLabel =
           LowerGeneratorHelper::GetEpilogueForReturnStatements(&this->m_lowerGeneratorHelper);
      LowerGeneratorHelper::InsertNullOutGeneratorFrameInEpilogue
                (&this->m_lowerGeneratorHelper,epilogueLabel);
    }
  }
  exitInstr = IR::Instr::AsExitInstr(pIVar1);
  LowererMD::LowerExitInstr(&this->m_lowererMD,exitInstr);
  return;
}

Assistant:

void
Lowerer::LowerPrologEpilog()
{
    IR::Instr * instr;

    instr = m_func->m_headInstr;
    AssertMsg(instr->IsEntryInstr(), "First instr isn't an EntryInstr...");

    m_lowererMD.LowerEntryInstr(instr->AsEntryInstr());

    instr = m_func->m_exitInstr;
    AssertMsg(instr->IsExitInstr(), "Last instr isn't an ExitInstr...");

    if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        IR::LabelInstr* epilogueLabel = this->m_lowerGeneratorHelper.GetEpilogueForReturnStatements();
        this->m_lowerGeneratorHelper.InsertNullOutGeneratorFrameInEpilogue(epilogueLabel);
    }

    m_lowererMD.LowerExitInstr(instr->AsExitInstr());
}